

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uchar *data_00;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  int in_R8D;
  float *hdr_data;
  uchar *data;
  int in_stack_000003fc;
  int *in_stack_00000400;
  int *in_stack_00000408;
  int *in_stack_00000410;
  stbi__context *in_stack_00000418;
  stbi__context *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  float *local_8;
  
  iVar1 = stbi__hdr_test(in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    data_00 = stbi__load_flip(in_RDI,in_RSI,in_RDX,in_RCX,in_R8D);
    if (data_00 == (uchar *)0x0) {
      stbi__err("unknown image type");
      local_8 = (float *)0x0;
    }
    else {
      local_8 = stbi__ldr_to_hdr(data_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                 (int)in_stack_ffffffffffffffc0,*in_RDX);
    }
  }
  else {
    local_8 = stbi__hdr_load(in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400
                             ,in_stack_000003fc);
    if (local_8 != (float *)0x0) {
      stbi__float_postprocess(local_8,in_RSI,in_RDX,in_RCX,in_R8D);
    }
  }
  return local_8;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}